

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void __thiscall leveldb::_Test_CustomComparator::_Run(_Test_CustomComparator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  NumberComparator cmp;
  char buf [100];
  Options new_options;
  undefined1 local_321;
  string local_320;
  DBTest *local_300;
  Status local_2f8;
  Status local_2f0;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  Comparator local_2e0;
  string local_2d8 [3];
  ulong local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240 [2];
  char *local_230;
  char *local_228;
  int local_220;
  stringstream local_218 [392];
  Options local_90;
  
  local_2e0._vptr_Comparator = (_func_int **)&PTR__Comparator_0015bba0;
  DBTest::CurrentOptions(&local_90,&this->super_DBTest);
  local_90.create_if_missing = true;
  local_90.comparator = &local_2e0;
  local_90.filter_policy = (FilterPolicy *)0x0;
  local_90.write_buffer_size = 1000;
  DBTest::DestroyAndReopen(&this->super_DBTest,&local_90);
  local_230 = (char *)CONCAT71(local_230._1_7_,true);
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_220 = 0x619;
  std::__cxx11::stringstream::stringstream(local_218);
  paVar1 = &local_2d8[0].field_2;
  local_2d8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"[10]","");
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"ten","");
  local_2f8.state_._0_1_ = 0;
  local_260 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8[0]._M_dataplus._M_p;
  uStack_258 = local_2d8[0]._M_string_length;
  local_240[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_320._M_dataplus._M_p;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_2f0);
  test::Tester::IsOk((Tester *)&local_230,&local_2f0);
  if ((void *)CONCAT44(local_2f0.state_._4_4_,local_2f0.state_._0_4_) != (void *)0x0) {
    operator_delete__((void *)CONCAT44(local_2f0.state_._4_4_,local_2f0.state_._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8[0]._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)&local_230);
  local_230 = (char *)CONCAT71(local_230._1_7_,1);
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_220 = 0x61a;
  std::__cxx11::stringstream::stringstream(local_218);
  local_2d8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"[0x14]","");
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"twenty","");
  local_2f8.state_._0_1_ = 0;
  local_260 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8[0]._M_dataplus._M_p;
  uStack_258 = local_2d8[0]._M_string_length;
  local_240[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_320._M_dataplus._M_p;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_2f0);
  test::Tester::IsOk((Tester *)&local_230,&local_2f0);
  if ((void *)CONCAT44(local_2f0.state_._4_4_,local_2f0.state_._0_4_) != (void *)0x0) {
    operator_delete__((void *)CONCAT44(local_2f0.state_._4_4_,local_2f0.state_._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p);
  }
  local_300 = &this->super_DBTest;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8[0]._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)&local_230);
  iVar4 = 1;
  do {
    local_230 = (char *)CONCAT71(local_230._1_7_,true);
    local_228 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_220 = 0x61c;
    std::__cxx11::stringstream::stringstream(local_218);
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"[10]","");
    DBTest::Get(local_2d8,local_300,&local_320,(Snapshot *)0x0);
    test::Tester::IsEq<char[4],std::__cxx11::string>
              ((Tester *)&local_230,(char (*) [4])"ten",local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d8[0]._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_230);
    local_230 = (char *)CONCAT71(local_230._1_7_,true);
    local_228 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_220 = 0x61d;
    std::__cxx11::stringstream::stringstream(local_218);
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"[0xa]","");
    DBTest::Get(local_2d8,local_300,&local_320,(Snapshot *)0x0);
    test::Tester::IsEq<char[4],std::__cxx11::string>
              ((Tester *)&local_230,(char (*) [4])"ten",local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d8[0]._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_230);
    local_230 = (char *)CONCAT71(local_230._1_7_,true);
    local_228 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_220 = 0x61e;
    std::__cxx11::stringstream::stringstream(local_218);
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"[20]","");
    DBTest::Get(local_2d8,local_300,&local_320,(Snapshot *)0x0);
    test::Tester::IsEq<char[7],std::__cxx11::string>
              ((Tester *)&local_230,(char (*) [7])"twenty",local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d8[0]._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_230);
    local_230 = (char *)CONCAT71(local_230._1_7_,true);
    local_228 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_220 = 0x61f;
    std::__cxx11::stringstream::stringstream(local_218);
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"[0x14]","");
    DBTest::Get(local_2d8,local_300,&local_320,(Snapshot *)0x0);
    test::Tester::IsEq<char[7],std::__cxx11::string>
              ((Tester *)&local_230,(char (*) [7])"twenty",local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d8[0]._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_230);
    local_230 = (char *)CONCAT71(local_230._1_7_,true);
    local_228 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_220 = 0x620;
    std::__cxx11::stringstream::stringstream(local_218);
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"[15]","");
    DBTest::Get(local_2d8,local_300,&local_320,(Snapshot *)0x0);
    test::Tester::IsEq<char[10],std::__cxx11::string>
              ((Tester *)&local_230,(char (*) [10])"NOT_FOUND",local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d8[0]._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_230);
    local_230 = (char *)CONCAT71(local_230._1_7_,true);
    local_228 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_220 = 0x621;
    std::__cxx11::stringstream::stringstream(local_218);
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"[0xf]","");
    DBTest::Get(local_2d8,local_300,&local_320,(Snapshot *)0x0);
    test::Tester::IsEq<char[10],std::__cxx11::string>
              ((Tester *)&local_230,(char (*) [10])"NOT_FOUND",local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d8[0]._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_230);
    local_230 = "[0]";
    local_228 = (char *)0x3;
    local_2d8[0]._M_dataplus._M_p = "[9999]";
    local_2d8[0]._M_string_length = 6;
    (*local_300->db_->_vptr_DB[0xb])(local_300->db_,(Tester *)&local_230,local_2d8);
    iVar4 = iVar4 + -1;
  } while (iVar4 == 0);
  uVar2 = 0;
  do {
    local_268 = (ulong)uVar2;
    uVar5 = 0;
    do {
      snprintf((char *)local_2d8,100,"[%d]",uVar5);
      local_230 = (char *)CONCAT71(local_230._1_7_,1);
      local_228 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
      local_220 = 0x629;
      std::__cxx11::stringstream::stringstream(local_218);
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      sVar3 = strlen((char *)local_2d8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_320,local_2d8,(long)&local_2d8[0]._M_dataplus._M_p + sVar3);
      local_260 = &local_250;
      sVar3 = strlen((char *)local_2d8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_260,local_2d8,(long)&local_2d8[0]._M_dataplus._M_p + sVar3);
      local_321 = 0;
      local_240[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_320._M_dataplus._M_p;
      local_2f0.state_._0_4_ = (undefined4)local_260;
      local_2f0.state_._4_4_ = local_260._4_4_;
      uStack_2e8 = (undefined4)uStack_258;
      uStack_2e4 = uStack_258._4_4_;
      (*local_300->db_->_vptr_DB[2])(&local_2f8,local_300->db_,&local_321,local_240,&local_2f0);
      test::Tester::IsOk((Tester *)&local_230,&local_2f8);
      if ((void *)CONCAT71(local_2f8.state_._1_7_,local_2f8.state_._0_1_) != (void *)0x0) {
        operator_delete__((void *)CONCAT71(local_2f8.state_._1_7_,local_2f8.state_._0_1_));
      }
      if (local_260 != &local_250) {
        operator_delete(local_260);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p);
      }
      test::Tester::~Tester((Tester *)&local_230);
      uVar2 = (int)uVar5 + 10;
      uVar5 = (ulong)uVar2;
    } while (uVar2 != 10000);
    local_230 = "[0]";
    local_228 = (char *)0x3;
    local_2d8[0]._M_dataplus._M_p = "[1000000]";
    local_2d8[0]._M_string_length = 9;
    (*local_300->db_->_vptr_DB[0xb])(local_300->db_,(Tester *)&local_230,local_2d8);
    uVar2 = (int)local_268 + 1;
  } while ((int)local_268 == 0);
  Comparator::~Comparator(&local_2e0);
  return;
}

Assistant:

TEST(DBTest, CustomComparator) {
  class NumberComparator : public Comparator {
   public:
    const char* Name() const override { return "test.NumberComparator"; }
    int Compare(const Slice& a, const Slice& b) const override {
      return ToNumber(a) - ToNumber(b);
    }
    void FindShortestSeparator(std::string* s, const Slice& l) const override {
      ToNumber(*s);  // Check format
      ToNumber(l);   // Check format
    }
    void FindShortSuccessor(std::string* key) const override {
      ToNumber(*key);  // Check format
    }

   private:
    static int ToNumber(const Slice& x) {
      // Check that there are no extra characters.
      ASSERT_TRUE(x.size() >= 2 && x[0] == '[' && x[x.size() - 1] == ']')
          << EscapeString(x);
      int val;
      char ignored;
      ASSERT_TRUE(sscanf(x.ToString().c_str(), "[%i]%c", &val, &ignored) == 1)
          << EscapeString(x);
      return val;
    }
  };
  NumberComparator cmp;
  Options new_options = CurrentOptions();
  new_options.create_if_missing = true;
  new_options.comparator = &cmp;
  new_options.filter_policy = nullptr;   // Cannot use bloom filters
  new_options.write_buffer_size = 1000;  // Compact more often
  DestroyAndReopen(&new_options);
  ASSERT_OK(Put("[10]", "ten"));
  ASSERT_OK(Put("[0x14]", "twenty"));
  for (int i = 0; i < 2; i++) {
    ASSERT_EQ("ten", Get("[10]"));
    ASSERT_EQ("ten", Get("[0xa]"));
    ASSERT_EQ("twenty", Get("[20]"));
    ASSERT_EQ("twenty", Get("[0x14]"));
    ASSERT_EQ("NOT_FOUND", Get("[15]"));
    ASSERT_EQ("NOT_FOUND", Get("[0xf]"));
    Compact("[0]", "[9999]");
  }

  for (int run = 0; run < 2; run++) {
    for (int i = 0; i < 1000; i++) {
      char buf[100];
      snprintf(buf, sizeof(buf), "[%d]", i * 10);
      ASSERT_OK(Put(buf, buf));
    }
    Compact("[0]", "[1000000]");
  }
}